

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_oFFs(png_const_structrp png_ptr,png_inforp info_ptr,png_int_32 offset_x,
                 png_int_32 offset_y,int unit_type)

{
  byte *pbVar1;
  
  if (info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) {
    info_ptr->x_offset = offset_x;
    info_ptr->y_offset = offset_y;
    info_ptr->offset_unit_type = (png_byte)unit_type;
    pbVar1 = (byte *)((long)&info_ptr->valid + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  return;
}

Assistant:

void PNGAPI
png_set_oFFs(png_const_structrp png_ptr, png_inforp info_ptr,
    png_int_32 offset_x, png_int_32 offset_y, int unit_type)
{
   png_debug1(1, "in %s storage function", "oFFs");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   info_ptr->x_offset = offset_x;
   info_ptr->y_offset = offset_y;
   info_ptr->offset_unit_type = (png_byte)unit_type;
   info_ptr->valid |= PNG_INFO_oFFs;
}